

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AuthCheck(Parse *pParse,int code,char *zArg1,char *zArg2,char *zArg3)

{
  sqlite3 *psVar1;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  Parse *in_RDI;
  char *in_R8;
  int rc;
  sqlite3 *db;
  int local_3c;
  int local_4;
  
  psVar1 = in_RDI->db;
  if (((psVar1->init).busy == '\0') && (in_RDI->declareVtab == '\0')) {
    if (psVar1->xAuth == (sqlite3_xauth)0x0) {
      local_4 = 0;
    }
    else {
      local_3c = (*psVar1->xAuth)(psVar1->pAuthArg,in_ESI,in_RDX,in_RCX,in_R8,in_RDI->zAuthContext);
      if (local_3c == 1) {
        sqlite3ErrorMsg(in_RDI,"not authorized");
        in_RDI->rc = 0x17;
      }
      else if ((local_3c != 0) && (local_3c != 2)) {
        local_3c = 1;
        sqliteAuthBadReturnCode((Parse *)0x17fb39);
      }
      local_4 = local_3c;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthCheck(
  Parse *pParse,
  int code,
  const char *zArg1,
  const char *zArg2,
  const char *zArg3
){
  sqlite3 *db = pParse->db;
  int rc;

  /* Don't do any authorization checks if the database is initialising
  ** or if the parser is being invoked from within sqlite3_declare_vtab.
  */
  if( db->init.busy || IN_DECLARE_VTAB ){
    return SQLITE_OK;
  }

  if( db->xAuth==0 ){
    return SQLITE_OK;
  }
  rc = db->xAuth(db->pAuthArg, code, zArg1, zArg2, zArg3, pParse->zAuthContext
#ifdef SQLITE_USER_AUTHENTICATION
                 ,db->auth.zAuthUser
#endif
                );
  if( rc==SQLITE_DENY ){
    sqlite3ErrorMsg(pParse, "not authorized");
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_OK && rc!=SQLITE_IGNORE ){
    rc = SQLITE_DENY;
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}